

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

int __thiscall ON_BinaryArchive::Read3dmDimStyle(ON_BinaryArchive *this,ON_DimStyle **ppDimStyle)

{
  uint uVar1;
  ON_DimStyle *src;
  bool bVar2;
  uint uVar3;
  ON_DimStyle **ppOVar4;
  ON_DimStyle *this_00;
  ON_DimStyle *managed_dim_style;
  ON_DimStyle *archive_dim_style;
  ON_DimStyle *pOStack_28;
  uint i;
  ON_DimStyle *dim_style;
  ON_DimStyle **ppDimStyle_local;
  ON_BinaryArchive *this_local;
  
  if (ppDimStyle != (ON_DimStyle **)0x0) {
    *ppDimStyle = (ON_DimStyle *)0x0;
  }
  if ((this->m_archive_dim_style_table_status == 1) &&
     (this->m_archive_dim_style_table_read_index < 0xfffffffe)) {
    pOStack_28 = (ON_DimStyle *)0x0;
    do {
      uVar1 = this->m_archive_dim_style_table_read_index;
      uVar3 = ON_SimpleArray<ON_DimStyle_*>::UnsignedCount(&this->m_archive_dim_style_table);
      if (uVar3 <= uVar1) goto LAB_004a8634;
      uVar1 = this->m_archive_dim_style_table_read_index;
      this->m_archive_dim_style_table_read_index = uVar1 + 1;
      ppOVar4 = ON_SimpleArray<ON_DimStyle_*>::operator[](&this->m_archive_dim_style_table,uVar1);
      src = *ppOVar4;
    } while ((src == (ON_DimStyle *)0x0) ||
            (bVar2 = ON_ModelComponent::ParentIdIsNotNil(&src->super_ON_ModelComponent), bVar2));
    this_00 = (ON_DimStyle *)operator_new(0x450);
    ON_DimStyle::ON_DimStyle(this_00,src);
    ppOVar4 = ON_SimpleArray<ON_DimStyle_*>::operator[](&this->m_archive_dim_style_table,uVar1);
    *ppOVar4 = this_00;
    ON_3dmAnnotationContext::UpdateReferencedDimStyle(&this->m_annotation_context,src,this_00);
    pOStack_28 = src;
    if (src == this->m_archive_current_dim_style) {
      this->m_archive_current_dim_style = this_00;
    }
LAB_004a8634:
    if (pOStack_28 == (ON_DimStyle *)0x0) {
      this->m_archive_dim_style_table_read_index = 0xfffffffe;
      this_local._4_4_ = 0;
    }
    else {
      if (ppDimStyle != (ON_DimStyle **)0x0) {
        *ppDimStyle = pOStack_28;
      }
      this_local._4_4_ = 1;
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x2c11,"",
               "All calls to Read3dmDimStyle() must be after a single call to BeginRead3dmDimStyleTable() and before a single call to EndRead3dmDimStyleTable()."
              );
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int ON_BinaryArchive::Read3dmDimStyle(
  class ON_DimStyle** ppDimStyle
)
{
  if (nullptr != ppDimStyle)
    *ppDimStyle = nullptr;

  if (1 != m_archive_dim_style_table_status || m_archive_dim_style_table_read_index >= ON_UNSET_UINT_INDEX - 1)
  {
    ON_ERROR("All calls to Read3dmDimStyle() must be after a single call to BeginRead3dmDimStyleTable() and before a single call to EndRead3dmDimStyleTable().");
    return 0;
  }

  ON_DimStyle* dim_style = nullptr;
  while (m_archive_dim_style_table_read_index < m_archive_dim_style_table.UnsignedCount())
  {
    const unsigned int i = m_archive_dim_style_table_read_index++;
    ON_DimStyle* archive_dim_style = m_archive_dim_style_table[i];
    if (nullptr == archive_dim_style)
      continue;
    if (archive_dim_style->ParentIdIsNotNil())
      continue;

    ON_DimStyle* managed_dim_style = new ON_DimStyle(*archive_dim_style);
    m_archive_dim_style_table[i] = managed_dim_style;
    m_annotation_context.UpdateReferencedDimStyle(archive_dim_style, managed_dim_style);
    if (archive_dim_style == m_archive_current_dim_style)
      m_archive_current_dim_style = managed_dim_style;
    dim_style = archive_dim_style;
    break;
  }

  if (nullptr == dim_style)
  {
    m_archive_dim_style_table_read_index = ON_UNSET_UINT_INDEX - 1;
    return 0;
  }

  if (nullptr != ppDimStyle)
    *ppDimStyle = dim_style;

  return 1;
}